

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  __off_t _Var1;
  int *piVar2;
  ssize_t sVar3;
  uchar *wb;
  ssize_t rs;
  size_t rsize;
  int r;
  _7zip_conflict *zip;
  uint64_t length_local;
  uint64_t offset_local;
  archive_write *a_local;
  
  piVar2 = (int *)a->format_data;
  zip = (_7zip_conflict *)length;
  if ((*(long *)(piVar2 + 2) == 0) || (_Var1 = lseek(*piVar2,offset,0), -1 < _Var1)) {
    do {
      if (zip == (_7zip_conflict *)0x0) {
        return 0;
      }
      if (*(_7zip_conflict **)(piVar2 + 0x3c42) < zip) {
        rs = *(ssize_t *)(piVar2 + 0x3c42);
      }
      else {
        rs = (ssize_t)zip;
      }
      sVar3 = read(*piVar2,(void *)((long)piVar2 + (0xf108 - *(long *)(piVar2 + 0x3c42))),rs);
      if (sVar3 < 0) {
        piVar2 = __errno_location();
        archive_set_error(&a->archive,*piVar2,"Can\'t read temporary file(%jd)",sVar3);
        return -0x1e;
      }
      if (sVar3 == 0) {
        archive_set_error(&a->archive,0,"Truncated 7-Zip archive");
        return -0x1e;
      }
      *(long *)(piVar2 + 0x3c42) = *(long *)(piVar2 + 0x3c42) - sVar3;
      zip = (_7zip_conflict *)((long)zip - sVar3);
    } while ((*(long *)(piVar2 + 0x3c42) != 0) ||
            (a_local._4_4_ = flush_wbuff(a), a_local._4_4_ == 0));
  }
  else {
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"lseek failed");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct _7zip *zip;
	int r;

	zip = (struct _7zip *)a->format_data;
	if (zip->temp_offset > 0 &&
	    lseek(zip->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > zip->wbuff_remaining)
			rsize = zip->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = zip->wbuff + (sizeof(zip->wbuff) - zip->wbuff_remaining);
		rs = read(zip->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		zip->wbuff_remaining -= rs;
		length -= rs;
		if (zip->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}